

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack19_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x80000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 0xd;
  *puVar1 = (in[2] - base) * 0x40 | *puVar1;
  *puVar1 = (in[3] - base) * 0x2000000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] - base >> 7;
  *puVar1 = (in[4] - base) * 0x1000 | *puVar1;
  *puVar1 = (in[5] - base) * -0x80000000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[5] - base >> 1;
  *puVar1 = (in[6] - base) * 0x40000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[6] - base >> 0xe;
  *puVar1 = (in[7] - base) * 0x20 | *puVar1;
  *puVar1 = (in[8] - base) * 0x1000000 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[8] - base >> 8;
  *puVar1 = (in[9] - base) * 0x800 | *puVar1;
  *puVar1 = (in[10] - base) * 0x40000000 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[10] - base >> 2;
  *puVar1 = (in[0xb] - base) * 0x20000 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[0xb] - base >> 0xf;
  *puVar1 = (in[0xc] - base) * 0x10 | *puVar1;
  *puVar1 = (in[0xd] - base) * 0x800000 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0xd] - base >> 9;
  *puVar1 = (in[0xe] - base) * 0x400 | *puVar1;
  *puVar1 = (in[0xf] - base) * 0x20000000 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0xf] - base >> 3;
  *puVar1 = (in[0x10] - base) * 0x10000 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0x10] - base >> 0x10;
  *puVar1 = (in[0x11] - base) * 8 | *puVar1;
  *puVar1 = (in[0x12] - base) * 0x400000 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0x12] - base >> 10;
  *puVar1 = (in[0x13] - base) * 0x200 | *puVar1;
  *puVar1 = (in[0x14] - base) * 0x10000000 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0x14] - base >> 4;
  *puVar1 = (in[0x15] - base) * 0x8000 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0x15] - base >> 0x11;
  *puVar1 = (in[0x16] - base) * 4 | *puVar1;
  *puVar1 = (in[0x17] - base) * 0x200000 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0x17] - base >> 0xb;
  *puVar1 = (in[0x18] - base) * 0x100 | *puVar1;
  *puVar1 = (in[0x19] - base) * 0x8000000 | *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0x19] - base >> 5;
  *puVar1 = (in[0x1a] - base) * 0x4000 | *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0x1a] - base >> 0x12;
  *puVar1 = (in[0x1b] - base) * 2 | *puVar1;
  *puVar1 = (in[0x1c] - base) * 0x100000 | *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0x1c] - base >> 0xc;
  *puVar1 = (in[0x1d] - base) * 0x80 | *puVar1;
  *puVar1 = (in[0x1e] - base) * 0x4000000 | *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0x1e] - base >> 6;
  *puVar1 = (in[0x1f] - base) * 0x2000 | *puVar1;
  return out + 0x13;
}

Assistant:

uint32_t * pack19_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  18 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  11 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  3 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  3 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  9 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  15 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  15 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  1 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  7 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  13 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++out;
    ++in;

    return out;
}